

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrPublishSpatialAnchorsCompleteML
                   (XrSpatialAnchorsStorageML storage,XrFutureEXT future,
                   XrSpatialAnchorsPublishCompletionML *completion)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrSpatialAnchorsStorageML_T_*>::getWithInstanceInfo
                    (&g_spatialanchorsstorageml_info,storage);
  XVar1 = (*(pVar2.second)->dispatch_table->PublishSpatialAnchorsCompleteML)
                    (storage,future,completion);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrPublishSpatialAnchorsCompleteML(
    XrSpatialAnchorsStorageML storage,
    XrFutureEXT future,
    XrSpatialAnchorsPublishCompletionML* completion) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_spatialanchorsstorageml_info.getWithInstanceInfo(storage);
        GenValidUsageXrHandleInfo *gen_spatialanchorsstorageml_info = info_with_instance.first;
        (void)gen_spatialanchorsstorageml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->PublishSpatialAnchorsCompleteML(storage, future, completion);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}